

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateVariableDefinition(ExpressionEvalContext *ctx,ExprVariableDefinition *expression)

{
  StackFrame *pSVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  bool bVar5;
  int iVar6;
  StackFrame **ppSVar7;
  ExprPointerLiteral *pEVar8;
  undefined4 extraout_var;
  ExprBase *pEVar9;
  StackVariable local_28;
  
  bVar5 = AddInstruction(ctx);
  if (bVar5) {
    ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames);
    pSVar1 = *ppSVar7;
    pEVar8 = FindVariableStorage(ctx,expression->variable->variable,true);
    if (pEVar8 == (ExprPointerLiteral *)0x0) {
      local_28.ptr = AllocateTypeStorage(ctx,(expression->super_ExprBase).source,
                                         expression->variable->variable->type);
      if (local_28.ptr == (ExprPointerLiteral *)0x0) goto LAB_0022ce5b;
      local_28.variable = expression->variable->variable;
      SmallArray<ExpressionEvalContext::StackVariable,_32U>::push_back(&pSVar1->variables,&local_28)
      ;
    }
    if ((pSVar1->targetYield == 0) && (expression->initializer != (ExprBase *)0x0)) {
      pEVar9 = Evaluate(ctx,expression->initializer);
      if (pEVar9 == (ExprBase *)0x0) goto LAB_0022ce5b;
    }
    pAVar2 = ctx->ctx->allocator;
    iVar6 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar6);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar9->typeID = 2;
    pEVar9->source = pSVar3;
    pEVar9->type = pTVar4;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e3b40;
    pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
  }
  else {
LAB_0022ce5b:
    pEVar9 = (ExprBase *)0x0;
  }
  return pEVar9;
}

Assistant:

ExprBase* EvaluateVariableDefinition(ExpressionEvalContext &ctx, ExprVariableDefinition *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExpressionEvalContext::StackFrame *frame = ctx.stackFrames.back();

	if(FindVariableStorage(ctx, expression->variable->variable, true) == NULL)
	{
		TypeBase *type = expression->variable->variable->type;

		ExprPointerLiteral *storage = AllocateTypeStorage(ctx, expression->source, type);

		if(!storage)
			return NULL;

		frame->variables.push_back(ExpressionEvalContext::StackVariable(expression->variable->variable, storage));
	}

	if(!frame->targetYield)
	{
		if(expression->initializer)
		{
			if(!Evaluate(ctx, expression->initializer))
				return NULL;
		}
	}

	return CheckType(expression, new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid));
}